

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::setReportHandler2(Synth *this,ReportHandler2 *reportHandler2)

{
  Extensions *pEVar1;
  
  if (reportHandler2 == (ReportHandler2 *)0x0) {
    pEVar1 = this->extensions;
    reportHandler2 = &pEVar1->defaultReportHandler;
    this->reportHandler = &reportHandler2->super_ReportHandler;
  }
  else {
    this->reportHandler = &reportHandler2->super_ReportHandler;
    pEVar1 = this->extensions;
  }
  pEVar1->reportHandler2 = reportHandler2;
  return;
}

Assistant:

void Synth::setReportHandler2(ReportHandler2 *reportHandler2) {
	if (reportHandler2 != NULL) {
		reportHandler = reportHandler2;
		extensions.reportHandler2 = reportHandler2;
	} else {
		reportHandler = &extensions.defaultReportHandler;
		extensions.reportHandler2 = &extensions.defaultReportHandler;
	}
}